

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestList.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1fffe::TestListAdderAddsTestToList::RunImpl(TestListAdderAddsTestToList *this)

{
  TestResults *pTVar1;
  bool bVar2;
  Test *pTVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_d0 [2];
  TestDetails local_90;
  ListAdder local_59;
  undefined1 local_58 [7];
  ListAdder adder;
  Test test;
  TestList list;
  TestListAdderAddsTestToList *this_local;
  
  UnitTest::TestList::TestList((TestList *)&test.m_timeConstraintExempt);
  UnitTest::Test::Test((Test *)local_58,"","DefaultSuite","",0);
  UnitTest::ListAdder::ListAdder
            (&local_59,(TestList *)&test.m_timeConstraintExempt,(Test *)local_58);
  pTVar3 = UnitTest::TestList::GetHead((TestList *)&test.m_timeConstraintExempt);
  bVar2 = UnitTest::Check<bool>(pTVar3 == (Test *)local_58);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar5,0x2e);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_90,"list.GetHead() == &test");
  }
  bVar2 = UnitTest::Check<bool>(test.m_details._24_8_ == 0);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_d0,*ppTVar5,0x2f);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_d0,"test.next == 0");
  }
  UnitTest::Test::~Test((Test *)local_58);
  return;
}

Assistant:

TEST (ListAdderAddsTestToList)
{
    TestList list;

    Test test("");    
    ListAdder adder(list, &test);

    CHECK (list.GetHead() == &test);
    CHECK (test.next == 0);
}